

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2aTextureMipmapTests.cpp
# Opt level: O2

void deqp::gles2::Accuracy::getBasicTexCoord2D
               (vector<float,_std::allocator<float>_> *dst,int cellNdx)

{
  int iVar1;
  
  if (getBasicTexCoord2D(std::vector<float,std::allocator<float>>&,int)::s_basicCoords == '\0') {
    iVar1 = __cxa_guard_acquire(&getBasicTexCoord2D(std::vector<float,std::allocator<float>>&,int)::
                                 s_basicCoords);
    if (iVar1 != 0) {
      getBasicTexCoord2D::s_basicCoords[0] = _DAT_01801470;
      getBasicTexCoord2D::s_basicCoords[1] = _DAT_01801480;
      getBasicTexCoord2D::s_basicCoords[2] = _DAT_01801490;
      getBasicTexCoord2D::s_basicCoords[3] = _DAT_018014a0;
      getBasicTexCoord2D::s_basicCoords[4] = _DAT_018014b0;
      getBasicTexCoord2D::s_basicCoords[5] = _DAT_018014c0;
      getBasicTexCoord2D::s_basicCoords[6] = _DAT_018014d0;
      getBasicTexCoord2D::s_basicCoords[7] = _DAT_018014e0;
      getBasicTexCoord2D::s_basicCoords[8] = _DAT_018014f0;
      getBasicTexCoord2D::s_basicCoords[9] = _DAT_01801500;
      getBasicTexCoord2D::s_basicCoords[10] = _DAT_01801510;
      getBasicTexCoord2D::s_basicCoords[0xb] = _DAT_01801520;
      getBasicTexCoord2D::s_basicCoords[0xc] = _DAT_01801530;
      getBasicTexCoord2D::s_basicCoords[0xd] = _DAT_01801540;
      getBasicTexCoord2D::s_basicCoords[0xe] = _DAT_01801550;
      getBasicTexCoord2D::s_basicCoords[0xf] = _DAT_01801560;
      __cxa_guard_release(&getBasicTexCoord2D(std::vector<float,std::allocator<float>>&,int)::
                           s_basicCoords);
    }
  }
  glu::TextureTestUtil::computeQuadTexCoord2D
            (dst,&getBasicTexCoord2D::s_basicCoords[cellNdx].bottomLeft,
             &getBasicTexCoord2D::s_basicCoords[cellNdx].topRight);
  return;
}

Assistant:

static void getBasicTexCoord2D (std::vector<float>& dst, int cellNdx)
{
	static const struct
	{
		Vec2 bottomLeft;
		Vec2 topRight;
	} s_basicCoords[] =
	{
		{ Vec2(-0.1f,  0.1f), Vec2( 0.8f,  1.0f) },
		{ Vec2(-0.3f, -0.6f), Vec2( 0.7f,  0.4f) },
		{ Vec2(-0.3f,  0.6f), Vec2( 0.7f, -0.9f) },
		{ Vec2(-0.8f,  0.6f), Vec2( 0.7f, -0.9f) },

		{ Vec2(-0.5f, -0.5f), Vec2( 1.5f,  1.5f) },
		{ Vec2( 1.0f, -1.0f), Vec2(-1.3f,  1.0f) },
		{ Vec2( 1.2f, -1.0f), Vec2(-1.3f,  1.6f) },
		{ Vec2( 2.2f, -1.1f), Vec2(-1.3f,  0.8f) },

		{ Vec2(-1.5f,  1.6f), Vec2( 1.7f, -1.4f) },
		{ Vec2( 2.0f,  1.6f), Vec2( 2.3f, -1.4f) },
		{ Vec2( 1.3f, -2.6f), Vec2(-2.7f,  2.9f) },
		{ Vec2(-0.8f, -6.6f), Vec2( 6.0f, -0.9f) },

		{ Vec2( -8.0f,   9.0f), Vec2(  8.3f,  -7.0f) },
		{ Vec2(-16.0f,  10.0f), Vec2( 18.3f,  24.0f) },
		{ Vec2( 30.2f,  55.0f), Vec2(-24.3f,  -1.6f) },
		{ Vec2(-33.2f,  64.1f), Vec2( 32.1f, -64.1f) },
	};

	DE_ASSERT(de::inBounds(cellNdx, 0, DE_LENGTH_OF_ARRAY(s_basicCoords)));

	const Vec2& bottomLeft	= s_basicCoords[cellNdx].bottomLeft;
	const Vec2& topRight	= s_basicCoords[cellNdx].topRight;

	computeQuadTexCoord2D(dst, bottomLeft, topRight);
}